

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O2

VmConstant *
CreateConstantStruct(Allocator *allocator,SynBase *source,char *value,int size,TypeBase *structType)

{
  int iVar1;
  undefined4 extraout_var;
  VmType type;
  VmConstant *this;
  
  if ((size & 3U) == 0) {
    iVar1 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var,iVar1);
    type = VmType::Struct((long)size,structType);
    VmConstant::VmConstant(this,allocator,type,source);
    this->sValue = value;
    return this;
  }
  __assert_fail("size % 4 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                ,0x7c,
                "VmConstant *CreateConstantStruct(Allocator *, SynBase *, char *, int, TypeBase *)")
  ;
}

Assistant:

VmConstant* CreateConstantStruct(Allocator *allocator, SynBase *source, char *value, int size, TypeBase *structType)
{
	assert(size % 4 == 0);

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Struct(size, structType), source);

	result->sValue = value;

	return result;
}